

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

obj * select_rwep(monst *mtmp)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  int prop;
  char mlet;
  obj *poStack_20;
  int i;
  obj *otmp;
  monst *mtmp_local;
  
  cVar1 = mtmp->data->mlet;
  propellor = &zeroobj;
  mtmp_local = (monst *)oselect(mtmp,0x10f);
  if (((mtmp_local == (monst *)0x0) &&
      ((cVar1 != '%' || (mtmp_local = (monst *)oselect(mtmp,0x120), mtmp_local == (monst *)0x0))))
     && (((mtmp->data->mflags2 & 0x8000000) == 0 ||
         (mtmp_local = (monst *)oselect(mtmp,0x214), mtmp_local == (monst *)0x0)))) {
    iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)mtmp->mux,(int)mtmp->muy);
    if ((iVar3 < 0xe) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) {
      for (prop = 0; prop < 0xd; prop = prop + 1) {
        if ((((((mtmp->data->mflags2 & 0x4000000) != 0) && ((mtmp->misc_worn_check & 8U) == 0)) ||
             ((*(ushort *)&objects[pwep[prop]].field_0x11 & 1) == 0)) &&
            (((*(ushort *)&objects[pwep[prop]].field_0x11 >> 4 & 0x1f) != 0xe ||
             (bVar2 = hates_silver(mtmp->data), bVar2 == '\0')))) &&
           (poVar4 = oselect(mtmp,pwep[prop]), poVar4 != (obj *)0x0)) {
          propellor = poVar4;
          return poVar4;
        }
      }
    }
    for (prop = 0; prop < 0x18; prop = prop + 1) {
      if (((rwep[prop] == 7) && ((mtmp->data->mflags2 & 0x20000000) == 0)) &&
         (poVar4 = m_carrying(mtmp,0x46), poVar4 != (obj *)0x0)) {
        for (poStack_20 = mtmp->minvent; poStack_20 != (obj *)0x0; poStack_20 = poStack_20->nobj) {
          if ((poStack_20->oclass == '\r') &&
             ((poStack_20->otyp != 0x210 || ((*(uint *)&poStack_20->field_0x4a & 1) == 0)))) {
            propellor = m_carrying(mtmp,0x46);
            return poStack_20;
          }
        }
      }
      propellor = &zeroobj;
      cVar1 = objects[rwep[prop]].oc_subtyp;
      if (cVar1 < '\0') {
        if (cVar1 == -0x16) {
          propellor = oselect(mtmp,0x45);
          if (propellor == (obj *)0x0) {
            propellor = oselect(mtmp,0x43);
          }
          if (propellor == (obj *)0x0) {
            propellor = oselect(mtmp,0x42);
          }
          if (propellor == (obj *)0x0) {
            propellor = oselect(mtmp,0x44);
          }
        }
        else if (cVar1 == -0x17) {
          propellor = oselect(mtmp,0x46);
        }
        else if (cVar1 == -0x18) {
          propellor = oselect(mtmp,0x47);
        }
        poVar4 = mtmp->mw;
        if ((((poVar4 != (obj *)0x0) && ((*(uint *)&poVar4->field_0x4a & 1) != 0)) &&
            (poVar4 != propellor)) && (mtmp->weapon_check == '\0')) {
          propellor = (obj *)0x0;
        }
      }
      if (propellor != (obj *)0x0) {
        if (rwep[prop] == 0x210) {
          for (poStack_20 = mtmp->minvent; poStack_20 != (obj *)0x0; poStack_20 = poStack_20->nobj)
          {
            if ((poStack_20->otyp == 0x210) && ((*(uint *)&poStack_20->field_0x4a & 1) == 0)) {
              return poStack_20;
            }
          }
        }
        else {
          poVar4 = oselect(mtmp,rwep[prop]);
          if ((poVar4 != (obj *)0x0) && (poVar4->oartifact == '\0')) {
            if ((*(uint *)&poVar4->field_0x4a & 1) == 0) {
              return poVar4;
            }
            if (poVar4 != mtmp->mw) {
              return poVar4;
            }
          }
        }
      }
    }
    mtmp_local = (monst *)0x0;
  }
  return (obj *)mtmp_local;
}

Assistant:

struct obj *select_rwep(struct monst *mtmp)
{
	struct obj *otmp;
	int i;

	char mlet = mtmp->data->mlet;

	propellor = &zeroobj;
	Oselect(EGG); /* cockatrice egg */
	if (mlet == S_KOP)	/* pies are first choice for Kops */
	    Oselect(CREAM_PIE);
	if (throws_rocks(mtmp->data))	/* ...boulders for giants */
	    Oselect(BOULDER);

	/* Select polearms first; they do more damage and aren't expendable */
	/* The limit of 13 here is based on the monster polearm range limit
	 * (defined as 5 in mthrowu.c).  5 corresponds to a distance of 2 in
	 * one direction and 1 in another; one space beyond that would be 3 in
	 * one direction and 2 in another; 3^2+2^2=13.
	 */
	if (dist2(mtmp->mx, mtmp->my, mtmp->mux, mtmp->muy) <= 13 && couldsee(mtmp->mx, mtmp->my)) {
	    for (i = 0; i < SIZE(pwep); i++) {
		/* Only strong monsters can wield big (esp. long) weapons.
		 * Big weapon is basically the same as bimanual.
		 * All monsters can wield the remaining weapons.
		 */
		if (((strongmonst(mtmp->data) && (mtmp->misc_worn_check & W_ARMS) == 0)
			|| !objects[pwep[i]].oc_bimanual) &&
		    (objects[pwep[i]].oc_material != SILVER
			|| !hates_silver(mtmp->data))) {
		    if ((otmp = oselect(mtmp, pwep[i])) != 0) {
			propellor = otmp; /* force the monster to wield it */
			return otmp;
		    }
		}
	    }
	}

	/*
	 * other than these two specific cases, always select the
	 * most potent ranged weapon to hand.
	 */
	for (i = 0; i < SIZE(rwep); i++) {
	    int prop;

	    /* shooting gems from slings; this goes just before the darts */
	    /* (shooting rocks is already handled via the rwep[] ordering) */
	    if (rwep[i] == DART && !likes_gems(mtmp->data) &&
		    m_carrying(mtmp, SLING)) {		/* propellor */
		for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		    if (otmp->oclass == GEM_CLASS &&
			    (otmp->otyp != LOADSTONE || !otmp->cursed)) {
			propellor = m_carrying(mtmp, SLING);
			return otmp;
		    }
	    }

		/* KMH -- This belongs here so darts will work */
	    propellor = &zeroobj;

	    prop = (objects[rwep[i]]).oc_skill;
	    if (prop < 0) {
		switch (-prop) {
		case P_BOW:
		  propellor = (oselect(mtmp, YUMI));
		  if (!propellor) propellor = (oselect(mtmp, ELVEN_BOW));
		  if (!propellor) propellor = (oselect(mtmp, BOW));
		  if (!propellor) propellor = (oselect(mtmp, ORCISH_BOW));
		  break;
		case P_SLING:
		  propellor = (oselect(mtmp, SLING));
		  break;
		case P_CROSSBOW:
		  propellor = (oselect(mtmp, CROSSBOW));
		}
		if ((otmp = MON_WEP(mtmp)) && otmp->cursed && otmp != propellor
				&& mtmp->weapon_check == NO_WEAPON_WANTED)
			propellor = 0;
	    }
	    /* propellor = obj, propellor to use
	     * propellor = &zeroobj, doesn't need a propellor
	     * propellor = 0, needed one and didn't have one
	     */
	    if (propellor != 0) {
		/* Note: cannot use m_carrying for loadstones, since it will
		 * always select the first object of a type, and maybe the
		 * monster is carrying two but only the first is unthrowable.
		 */
		if (rwep[i] != LOADSTONE) {
			/* Don't throw a cursed weapon-in-hand or an artifact */
			if ((otmp = oselect(mtmp, rwep[i])) && !otmp->oartifact
			    && (!otmp->cursed || otmp != MON_WEP(mtmp)))
				return otmp;
		} else for (otmp=mtmp->minvent; otmp; otmp=otmp->nobj) {
		    if (otmp->otyp == LOADSTONE && !otmp->cursed)
			return otmp;
		}
	    }
	  }

	/* failure */
	return NULL;
}